

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

string * duckdb::Timestamp::UnsupportedTimezoneError_abi_cxx11_(string_t str)

{
  string *in_RDI;
  string local_40;
  string_t local_20;
  
  string_t::GetString_abi_cxx11_(&local_40,&local_20);
  UnsupportedTimezoneError(in_RDI,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

string Timestamp::UnsupportedTimezoneError(string_t str) {
	return Timestamp::UnsupportedTimezoneError(str.GetString());
}